

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O1

_Bool borg_flow_dark(_Bool neer)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  loc_conflict grid1;
  _Bool _Var5;
  wchar_t wVar6;
  loc_conflict grid2;
  int in_EDX;
  uint8_t *extraout_RDX;
  uint8_t *extraout_RDX_00;
  uint8_t *extraout_RDX_01;
  uint8_t *extraout_RDX_02;
  uint8_t *puVar7;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  uint8_t *extraout_RDX_06;
  uint8_t *extraout_RDX_07;
  uint8_t *extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong uVar8;
  int iVar9;
  char *who;
  int iVar10;
  long lVar11;
  int iVar12;
  wchar_t wVar13;
  int iVar14;
  int iVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  ulong uVar19;
  
  if ((borg_morgoth_position) && (morgoth_on_level)) {
    return false;
  }
  _Var5 = borg_flow_dark_interesting(borg.c.y,borg.c.x,in_EDX);
  if (_Var5) {
    return false;
  }
  if (track_less.num < 1) {
    wVar6 = L'\xffffffff';
    puVar7 = extraout_RDX;
  }
  else {
    uVar8 = 0xffffffff;
    uVar19 = 0;
    wVar13 = L'\xffffffff';
    do {
      grid2 = loc(track_less.x[uVar19],track_less.y[uVar19]);
      grid1.y = borg.c.y;
      grid1.x = borg.c.x;
      wVar6 = distance(grid1,grid2);
      wVar16 = wVar13;
      if (wVar13 <= wVar6) {
        wVar16 = wVar6;
      }
      if (wVar13 < wVar6) {
        uVar8 = uVar19 & 0xffffffff;
      }
      wVar6 = (wchar_t)uVar8;
      uVar19 = uVar19 + 1;
      puVar7 = extraout_RDX_00;
      wVar13 = wVar16;
    } while ((long)uVar19 < (long)track_less.num);
  }
  iVar14 = borg.trait[0x69];
  if (neer) {
    if (iVar14 != 0) {
      borg_temp_n = 0;
      if (0 < borg_light_n) {
        lVar11 = 0;
        do {
          bVar2 = borg_light_y[lVar11];
          bVar3 = borg_light_x[lVar11];
          _Var5 = borg_flow_dark_interesting((uint)bVar2,(uint)bVar3,(int)puVar7);
          puVar7 = extraout_RDX_01;
          if ((_Var5) &&
             (_Var5 = borg_flow_far_from_stairs((uint)bVar3,(uint)bVar2,wVar6),
             puVar7 = extraout_RDX_02, !_Var5)) {
            borg_temp_x[borg_temp_n] = bVar3;
            puVar7 = borg_temp_y;
            borg_temp_y[borg_temp_n] = bVar2;
            borg_temp_n = borg_temp_n + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < borg_light_n);
      }
      if (borg_temp_n != 0) {
        if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
          borg_danger_wipe = true;
        }
        borg_flow_clear();
        if (0 < borg_temp_n) {
          lVar11 = 0;
          do {
            borg_flow_direct((uint)borg_temp_y[lVar11],(uint)borg_temp_x[lVar11]);
            lVar11 = lVar11 + 1;
          } while (lVar11 < borg_temp_n);
        }
        _Var5 = borg_flow_commit((char *)0x0,L'\x04');
        if ((_Var5) && (_Var5 = borg_flow_old(L'\x04'), _Var5)) {
          return true;
        }
      }
    }
    if (borg.trait[0x69] != 0) {
      iVar14 = borg.trait[0x1a];
      borg_temp_n = 0;
      lVar11 = 0;
      do {
        iVar12 = (int)ddy_ddd[lVar11] * (iVar14 + 1);
        if ((0xffffffbf < (iVar12 + borg.c.y) - 0x41U) &&
           (iVar15 = (int)ddx_ddd[lVar11] * (iVar14 + 1), 0xffffff3b < (iVar15 + borg.c.x) - 0xc5U))
        {
          wVar13 = iVar12 + borg.c.y;
          wVar16 = iVar15 + borg.c.x;
          if ((borg_grids[(uint)wVar13][(uint)wVar16].feat == '\0') &&
             (((borg_grids[(uint)wVar13][(uint)wVar16].info & 0x20) != 0 &&
              (_Var5 = borg_flow_far_from_stairs(wVar16,wVar13,wVar6), !_Var5)))) {
            borg_temp_x[borg_temp_n] = (uint8_t)wVar16;
            borg_temp_y[borg_temp_n] = (uint8_t)wVar13;
            borg_temp_n = borg_temp_n + 1;
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      if (borg_temp_n != 0) {
        if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
          borg_danger_wipe = true;
        }
        borg_flow_clear();
        if (0 < borg_temp_n) {
          lVar11 = 0;
          do {
            borg_flow_direct((uint)borg_temp_y[lVar11],(uint)borg_temp_x[lVar11]);
            lVar11 = lVar11 + 1;
          } while (lVar11 < borg_temp_n);
        }
        _Var5 = borg_flow_commit((char *)0x0,L'\x04');
        if ((_Var5) && (_Var5 = borg_flow_old(L'\x04'), _Var5)) {
          return true;
        }
      }
    }
    if (borg.trait[0x69] == 0) {
      return false;
    }
    iVar14 = 5;
    if (5 < borg.c.y) {
      iVar14 = borg.c.y;
    }
    iVar12 = 5;
    if (5 < borg.c.x) {
      iVar12 = borg.c.x;
    }
    iVar15 = 0x3c;
    if (borg.c.y < 0x3c) {
      iVar15 = borg.c.y;
    }
    iVar10 = 0xc0;
    if (borg.c.x < 0xc0) {
      iVar10 = borg.c.x;
    }
    borg_temp_n = 0;
    if (iVar14 + L'\xfffffffc' <= iVar15 + L'\x04') {
      uVar8 = (ulong)(iVar12 - 5);
      wVar13 = iVar14 + L'\xfffffffc';
      do {
        uVar19 = (ulong)(iVar12 - 5);
        if (iVar12 + L'\xfffffffc' <= iVar10 + L'\x04') {
          do {
            wVar16 = (int)uVar19 + L'\x01';
            _Var5 = borg_flow_dark_interesting(wVar13,wVar16,(int)uVar8);
            uVar8 = extraout_RDX_03;
            if (((_Var5) &&
                (_Var5 = borg_flow_dark_reachable(wVar13,wVar16), uVar8 = extraout_RDX_04, _Var5))
               && (_Var5 = borg_flow_far_from_stairs(wVar16,wVar13,wVar6), uVar8 = extraout_RDX_05,
                  !_Var5)) {
              borg_temp_x[borg_temp_n] = (char)uVar19 + '\x01';
              borg_temp_y[borg_temp_n] = (uint8_t)wVar13;
              borg_temp_n = borg_temp_n + 1;
            }
            uVar19 = (ulong)(uint)wVar16;
          } while (wVar16 < iVar10 + L'\x04');
        }
        bVar4 = wVar13 < iVar15 + L'\x04';
        wVar13 = wVar13 + L'\x01';
      } while (bVar4);
    }
    if (borg_temp_n == 0) {
      return false;
    }
    if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
      borg_danger_wipe = true;
    }
    borg_flow_clear();
    if (0 < borg_temp_n) {
      lVar11 = 0;
      do {
        borg_flow_enqueue_grid((uint)borg_temp_y[lVar11],(uint)borg_temp_x[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < borg_temp_n);
    }
    borg_flow_spread(L'\x05',false,true,false,L'\xffffffff',false);
    who = (char *)0x0;
  }
  else {
    if ((iVar14 != 0) && (vault_on_level == false)) {
      iVar12 = 0xc;
      if (0xc < borg.c.y) {
        iVar12 = borg.c.y;
      }
      iVar15 = 0xc;
      if (0xc < borg.c.x) {
        iVar15 = borg.c.x;
      }
      iVar10 = 0x35;
      if (borg.c.y < 0x35) {
        iVar10 = borg.c.y;
      }
      iVar9 = 0xb9;
      if (borg.c.x < 0xb9) {
        iVar9 = borg.c.x;
      }
      borg_temp_n = 0;
      uVar1 = borg.trait[0x23] - 5;
      puVar7 = (uint8_t *)(ulong)uVar1;
      wVar13 = L'ú';
      if ((int)uVar1 <= iVar14) {
        wVar13 = borg.trait[0x23] * 3 + L'\t';
      }
      if (iVar12 + L'\xfffffff5' <= iVar10 + L'\v') {
        wVar16 = iVar12 + L'\xfffffff5';
        do {
          wVar18 = iVar15 + L'\xfffffff4';
          if (iVar15 + L'\xfffffff5' <= iVar9 + L'\v') {
            do {
              wVar17 = wVar18 + L'\x01';
              _Var5 = borg_flow_dark_interesting(wVar16,wVar17,(int)puVar7);
              puVar7 = extraout_RDX_06;
              if (((_Var5) &&
                  (_Var5 = borg_flow_dark_reachable(wVar16,wVar17), puVar7 = extraout_RDX_07, _Var5)
                  ) && (_Var5 = borg_flow_far_from_stairs_dist(wVar17,wVar16,wVar6,wVar13),
                       puVar7 = extraout_RDX_08, !_Var5)) {
                borg_temp_x[borg_temp_n] = (char)wVar18 + '\x01';
                puVar7 = borg_temp_y;
                borg_temp_y[borg_temp_n] = (uint8_t)wVar16;
                borg_temp_n = borg_temp_n + 1;
              }
              wVar18 = wVar17;
            } while (wVar17 < iVar9 + L'\v');
          }
          bVar4 = wVar16 < iVar10 + L'\v';
          wVar16 = wVar16 + L'\x01';
        } while (bVar4);
      }
      if (borg_temp_n != 0) {
        if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
          borg_danger_wipe = true;
        }
        borg_flow_clear();
        if (0 < borg_temp_n) {
          lVar11 = 0;
          do {
            borg_flow_enqueue_grid((uint)borg_temp_y[lVar11],(uint)borg_temp_x[lVar11]);
            lVar11 = lVar11 + 1;
          } while (lVar11 < borg_temp_n);
        }
        borg_flow_border(iVar12 + -0xc,iVar15 + -0xc,iVar10 + 0xc,iVar9 + 0xc,true);
        wVar16 = L'ú';
        if (borg.trait[0x23] < 0xf) {
          wVar16 = wVar13;
        }
        borg_flow_spread(wVar16,true,true,false,L'\xffffffff',false);
        borg_flow_border(iVar12 + -0xc,iVar15 + -0xc,iVar10 + 0xc,iVar9 + 0xc,false);
        _Var5 = borg_flow_commit("dark-4",L'\x04');
        if ((_Var5) && (_Var5 = borg_flow_old(L'\x04'), _Var5)) {
          return true;
        }
      }
    }
    if (borg.trait[0x69] == 0) {
      return false;
    }
    borg_temp_n = 0;
    uVar1 = borg.trait[0x23] - 5;
    uVar8 = (ulong)uVar1;
    wVar13 = L'ú';
    if ((int)uVar1 <= borg.trait[0x69]) {
      wVar13 = borg.trait[0x23] * 3 + L'\t';
    }
    wVar16 = L'\x01';
    do {
      wVar18 = L'\x01';
      do {
        _Var5 = borg_flow_dark_interesting(wVar16,wVar18,(int)uVar8);
        uVar8 = extraout_RDX_09;
        if (((_Var5) &&
            (_Var5 = borg_flow_dark_reachable(wVar16,wVar18), uVar8 = extraout_RDX_10, _Var5)) &&
           (_Var5 = borg_flow_far_from_stairs_dist(wVar18,wVar16,wVar6,wVar13),
           uVar8 = extraout_RDX_11, !_Var5)) {
          borg_temp_x[borg_temp_n] = (uint8_t)wVar18;
          borg_temp_y[borg_temp_n] = (uint8_t)wVar16;
          borg_temp_n = borg_temp_n + 1;
          if (borg_temp_n == 9000) {
            wVar17 = L'B';
            break;
          }
        }
        wVar18 = wVar18 + L'\x01';
        wVar17 = wVar16;
      } while (wVar18 != L'Å');
      wVar16 = wVar17 + L'\x01';
    } while (wVar17 < L'@');
    if (borg_temp_n == 0) {
      return false;
    }
    if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
      borg_danger_wipe = true;
    }
    borg_flow_clear();
    if (0 < borg_temp_n) {
      lVar11 = 0;
      do {
        borg_flow_enqueue_grid((uint)borg_temp_y[lVar11],(uint)borg_temp_x[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < borg_temp_n);
    }
    if (((5 < borg.trait[0x23]) || (borg.trait[0x1b] < (int)avoidance)) &&
       ((0x1e < borg.trait[0x23] || (borg.trait[0x1b] < (int)avoidance)))) {
      wVar13 = L'ú';
    }
    borg_flow_spread(wVar13,true,true,false,L'\xffffffff',false);
    who = "dark-5";
  }
  _Var5 = borg_flow_commit(who,L'\x04');
  if ((_Var5) && (_Var5 = borg_flow_old(L'\x04'), _Var5)) {
    return true;
  }
  return false;
}

Assistant:

bool borg_flow_dark(bool neer)
{
    int i;
    int x, y, j, b_j = -1;
    int b_stair = -1;

    /* Not if sitting in a sea of runes and we saw Morgoth recently */
    if (borg_morgoth_position && morgoth_on_level)
        return false;

    /* Paranoia */
    if (borg_flow_dark_interesting(borg.c.y, borg.c.x, -1)) {
        return false;
    }

    /* Check distance away from stairs, used later */
    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Near */
    if (neer) {
        /* Method 1 */
        if (borg_flow_dark_1(b_stair))
            return true;

        /* Method 2 */
        if (borg_flow_dark_2(b_stair))
            return true;

        /* Method 3 */
        if (borg_flow_dark_3(b_stair))
            return true;
    }
    /* Far */
    else {
        /* Method 4 */
        if (borg_flow_dark_4(b_stair))
            return true;

        /* Method 5 */
        if (borg_flow_dark_5(b_stair))
            return true;
    }

    /* Fail */
    return false;
}